

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httprpc.cpp
# Opt level: O3

void JSONErrorReply(HTTPRequest *req,UniValue *objError,JSONRPCRequest *jreq)

{
  pointer *ppbVar1;
  UniValue error;
  optional<UniValue> id;
  span<const_std::byte,_18446744073709551615UL> reply;
  int iVar2;
  UniValue *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  int nStatus;
  long in_FS_OFFSET;
  string_view key;
  string strReply;
  UniValue in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe70;
  bool bVar6;
  undefined7 in_stack_fffffffffffffe79;
  VType VVar7;
  undefined4 in_stack_fffffffffffffe84;
  pointer pcVar8;
  size_type sVar9;
  size_type sVar10;
  undefined8 in_stack_fffffffffffffea0;
  pointer pbVar11;
  pointer pbVar12;
  pointer pbVar13;
  pointer pUVar14;
  pointer pUVar15;
  pointer pUVar16;
  VType VVar17;
  undefined4 in_stack_fffffffffffffedc;
  undefined1 *puVar18;
  undefined8 in_stack_fffffffffffffee8;
  long in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef8 [48];
  undefined1 local_d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<UniValue,_std::allocator<UniValue>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined8 local_58;
  __extent_storage<18446744073709551615UL> local_50;
  pointer local_48;
  pointer pbStack_40;
  pointer local_38;
  
  local_38 = *(pointer *)(in_FS_OFFSET + 0x28);
  key._M_str = "code";
  key._M_len = 4;
  this = UniValue::find_value(objError,key);
  iVar2 = UniValue::getInt<int>(this);
  iVar5 = 500;
  if (iVar2 == -0x7f59) {
    iVar5 = 0x194;
  }
  nStatus = 400;
  if (iVar2 != -0x7f58) {
    nStatus = iVar5;
  }
  puVar18 = &stack0xfffffffffffffef0;
  VVar17 = NullUniValue.typ;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffee0,NullUniValue.val._M_dataplus._M_p,
             NullUniValue.val._M_dataplus._M_p + NullUniValue.val._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xffffffffffffff00,&NullUniValue.keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffff18,
             &NullUniValue.values);
  VVar7 = objError->typ;
  pcVar8 = (objError->val)._M_dataplus._M_p;
  paVar4 = &(objError->val).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar8 == paVar4) {
    sVar10 = paVar4->_M_allocated_capacity;
    in_stack_fffffffffffffea0 = *(undefined8 *)((long)&(objError->val).field_2 + 8);
    pcVar8 = &stack0xfffffffffffffe98;
  }
  else {
    sVar10 = paVar4->_M_allocated_capacity;
  }
  sVar9 = (objError->val)._M_string_length;
  (objError->val)._M_dataplus._M_p = (pointer)paVar4;
  (objError->val)._M_string_length = 0;
  (objError->val).field_2._M_local_buf[0] = '\0';
  pbVar11 = (objError->keys).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar12 = (objError->keys).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar13 = (objError->keys).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (objError->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (objError->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (objError->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pUVar14 = (objError->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start;
  pUVar15 = (objError->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pUVar16 = (objError->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (objError->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (objError->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (objError->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar6 = false;
  if ((jreq->id).super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_engaged == true) {
    std::_Optional_payload_base<UniValue>::_M_construct<UniValue_const&>
              ((_Optional_payload_base<UniValue> *)&stack0xfffffffffffffe20,(UniValue *)jreq);
  }
  error.val._M_dataplus._M_p._0_1_ = bVar6;
  error._0_8_ = in_stack_fffffffffffffe70;
  error.val._M_dataplus._M_p._1_7_ = in_stack_fffffffffffffe79;
  error.val._M_string_length._0_4_ = VVar7;
  error.val._M_string_length._4_4_ = in_stack_fffffffffffffe84;
  error.val.field_2._M_allocated_capacity = (size_type)pcVar8;
  error.val.field_2._8_8_ = sVar9;
  error.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)sVar10;
  error.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffea0;
  error.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar11;
  error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pbVar12;
  error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pbVar13;
  error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pUVar14;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._M_value.val._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)pUVar16;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._0_8_ = pUVar15;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._M_value.val._M_string_length._0_4_ = VVar17;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._M_value.val._M_string_length._4_4_ = in_stack_fffffffffffffedc;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._24_8_ = puVar18;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._32_8_ = in_stack_fffffffffffffee8;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._M_value.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffef0;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _48_48_ = in_stack_fffffffffffffef8;
  JSONRPCReplyObj((UniValue *)local_d0,in_stack_fffffffffffffe18,error,id,
                  (JSONRPCVersion)&stack0xfffffffffffffed8);
  UniValue::write_abi_cxx11_((UniValue *)&local_78,(int)local_d0,(void *)0x0,0);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_78,"\n");
  local_58 = &local_48;
  ppbVar1 = (pointer *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ppbVar1 == paVar4) {
    local_48 = (pointer)paVar4->_M_allocated_capacity;
    pbStack_40 = *(pointer *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_48 = (pointer)paVar4->_M_allocated_capacity;
    local_58 = ppbVar1;
  }
  local_50._M_extent_value = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  paVar4 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar4) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._8_8_ != &local_b8) {
    operator_delete((void *)local_d0._8_8_,local_b8._M_allocated_capacity + 1);
  }
  if (bVar6 == true) {
    std::_Optional_payload_base<UniValue>::_M_destroy
              ((_Optional_payload_base<UniValue> *)&stack0xfffffffffffffe20);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffec0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffea8);
  if (pcVar8 != &stack0xfffffffffffffe98) {
    operator_delete(pcVar8,sVar10 + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffff18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffff00);
  if (puVar18 != &stack0xfffffffffffffef0) {
    operator_delete(puVar18,in_stack_fffffffffffffef0 + 1);
  }
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Content-Type","");
  local_78._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"application/json","");
  HTTPRequest::WriteHeader(req,(string *)local_d0,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar4) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  reply._M_extent._M_extent_value = local_50._M_extent_value;
  reply._M_ptr = (pointer)local_58;
  HTTPRequest::WriteReply(req,nStatus,reply);
  if ((pointer *)local_58 != &local_48) {
    operator_delete((void *)local_58,(ulong)((long)&(local_48->_M_dataplus)._M_p + 1));
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void JSONErrorReply(HTTPRequest* req, UniValue objError, const JSONRPCRequest& jreq)
{
    // Sending HTTP errors is a legacy JSON-RPC behavior.
    Assume(jreq.m_json_version != JSONRPCVersion::V2);

    // Send error reply from json-rpc error object
    int nStatus = HTTP_INTERNAL_SERVER_ERROR;
    int code = objError.find_value("code").getInt<int>();

    if (code == RPC_INVALID_REQUEST)
        nStatus = HTTP_BAD_REQUEST;
    else if (code == RPC_METHOD_NOT_FOUND)
        nStatus = HTTP_NOT_FOUND;

    std::string strReply = JSONRPCReplyObj(NullUniValue, std::move(objError), jreq.id, jreq.m_json_version).write() + "\n";

    req->WriteHeader("Content-Type", "application/json");
    req->WriteReply(nStatus, strReply);
}